

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SpawnPlayerMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  VMValue *pVVar2;
  AActor *pAVar3;
  FTranslatedLineTarget *pLineTarget;
  int iVar4;
  char *pcVar5;
  PClassActor *type;
  bool noautoaim;
  void *x;
  void *y;
  void *z;
  AActor *missileactor;
  DAngle local_38;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00434c7c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00434c63:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00434c7c:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad0,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_004349ce;
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00434c7c;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_00434c63;
LAB_004349ce:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00434c9b;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00434c6c:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00434c9b:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad1,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_00434a21;
    bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar1) {
      pcVar5 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_00434c9b;
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_00434c6c;
LAB_00434a21:
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pVVar2 = defaultparam->Array;
    if (pVVar2[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_00434d67;
    }
    local_38.Degrees = (double)pVVar2[2].field_0.field_1.a;
LAB_00434a5c:
    if (pVVar2[3].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00434d86:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad3,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    x = pVVar2[3].field_0.field_1.a;
LAB_00434a6b:
    if (pVVar2[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00434d36:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad4,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    y = pVVar2[4].field_0.field_1.a;
LAB_00434a7a:
    if (pVVar2[5].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00434d17:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad5,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    z = pVVar2[5].field_0.field_1.a;
LAB_00434a89:
    if ((pVVar2[6].field_0.field_3.Type != '\x03') || (pVVar2[6].field_0.field_1.atag != 0)) {
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
      ;
LAB_00434c4b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad6,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pLineTarget = (FTranslatedLineTarget *)pVVar2[6].field_0.field_1.a;
LAB_00434aa1:
    if (pVVar2[7].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00434cf8:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad7,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar1 = pVVar2[7].field_0.i != 0;
LAB_00434ab3:
    if (pVVar2[8].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00434cd9:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad8,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    noautoaim = pVVar2[8].field_0.i != 0;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00434d67:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad2,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_38.Degrees = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434a5c;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00434d86;
    }
    x = (void *)param[3].field_0.f;
    if ((uint)numparam < 5) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434a6b;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00434d36;
    }
    y = (void *)param[4].field_0.f;
    if (numparam == 5) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434a7a;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00434d17;
    }
    z = (void *)param[5].field_0.f;
    if ((uint)numparam < 7) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434a89;
    }
    if ((param[6].field_0.field_3.Type != '\x03') || (param[6].field_0.field_1.atag != 0)) {
      pcVar5 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
      goto LAB_00434c4b;
    }
    pLineTarget = (FTranslatedLineTarget *)param[6].field_0.field_1.a;
    if (numparam == 7) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434aa1;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00434cf8;
    }
    bVar1 = param[7].field_0.i != 0;
    if ((uint)numparam < 9) {
      pVVar2 = defaultparam->Array;
      goto LAB_00434ab3;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00434cd9;
    }
    noautoaim = param[8].field_0.i != 0;
    if (numparam != 9) {
      if (param[9].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_00434cba;
      }
      iVar4 = param[9].field_0.i;
      goto LAB_00434aec;
    }
    pVVar2 = defaultparam->Array;
  }
  if (pVVar2[9].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00434cba:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad9,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar4 = pVVar2[9].field_0.i;
  if (numparam == 2) {
    local_38.Degrees = (pAVar3->Angles).Yaw.Degrees;
  }
LAB_00434aec:
  pAVar3 = P_SpawnPlayerMissile
                     (pAVar3,(double)x,(double)y,(double)z,type,&local_38,pLineTarget,&missileactor,
                      bVar1,noautoaim,iVar4);
  iVar4 = numret;
  if (0 < numret) {
    iVar4 = 1;
    VMReturn::SetPointer(ret,pAVar3,1);
    if (numret != 1) {
      VMReturn::SetPointer(ret + 1,missileactor,1);
      iVar4 = 2;
    }
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnPlayerMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AActor);
	PARAM_ANGLE_DEF(angle);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_POINTER_DEF(lt, FTranslatedLineTarget);
	PARAM_BOOL_DEF(nofreeaim);
	PARAM_BOOL_DEF(noautoaim);
	PARAM_INT_DEF(aimflags);
	AActor *missileactor;
	if (numparam == 2) angle = self->Angles.Yaw;
	AActor *misl = P_SpawnPlayerMissile(self, x, y, z, type, angle, lt, &missileactor, nofreeaim, noautoaim, aimflags);
	if (numret > 0) ret[0].SetPointer(misl, ATAG_OBJECT);
	if (numret > 1) ret[1].SetPointer(missileactor, ATAG_OBJECT), numret = 2;
	return numret;
}